

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.c
# Opt level: O1

int quicly_recvbuf_receive
              (quicly_stream_t *stream,ptls_buffer_t *rb,size_t off,void *src,size_t len)

{
  ulong uVar1;
  int err;
  
  if (len != 0) {
    uVar1 = len + off;
    err = ptls_buffer_reserve(rb,uVar1 - rb->off);
    if (err == 0) {
      memcpy(rb->base + off,src,len);
      if (rb->off < uVar1) {
        rb->off = uVar1;
      }
    }
    else {
      convert_error(stream,err);
    }
    if (err != 0) {
      return -1;
    }
  }
  return 0;
}

Assistant:

int quicly_recvbuf_receive(quicly_stream_t *stream, ptls_buffer_t *rb, size_t off, const void *src, size_t len)
{
    if (len != 0) {
        int ret;
        if ((ret = ptls_buffer_reserve(rb, off + len - rb->off)) != 0) {
            convert_error(stream, ret);
            return -1;
        }
        memcpy(rb->base + off, src, len);
        if (rb->off < off + len)
            rb->off = off + len;
    }
    return 0;
}